

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprop.c
# Opt level: O3

void trn_rprop(mdl_t *mdl)

{
  long lVar1;
  opt_t *poVar2;
  char *pcVar3;
  long lVar4;
  double dVar5;
  grd_t *pgVar6;
  mdl_t *pmVar7;
  _Bool _Var8;
  int iVar9;
  double *x;
  double *pdVar10;
  double *x_00;
  FILE *pFVar11;
  undefined8 *puVar12;
  uint64_t uVar13;
  uint32_t it;
  ulong uVar14;
  void **ud;
  uint64_t uVar15;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  void *apvStack_b0 [2];
  uint64_t f;
  double vxp;
  double vstp;
  double vgp;
  ulong local_80;
  uint64_t nftr;
  grd_t *local_70;
  double *local_68;
  int local_60;
  uint32_t local_5c;
  int type;
  double *local_50;
  double local_48;
  mdl_t *local_40;
  byte local_31;
  long lVar20;
  
  poVar2 = mdl->opt;
  uVar15 = mdl->nftr;
  local_5c = poVar2->maxiter;
  local_48 = (double)(ulong)poVar2->nthread;
  apvStack_b0[0] = (void *)0x10df85;
  local_40 = mdl;
  iVar9 = strcmp(poVar2->algo,"rprop-");
  bVar16 = iVar9 == 0;
  _Var8 = (poVar2->rprop).cutoff;
  apvStack_b0[0] = (void *)0x10df9c;
  x = xvm_new(uVar15);
  apvStack_b0[0] = (void *)0x10dfa7;
  pdVar10 = xvm_new(uVar15);
  apvStack_b0[0] = (void *)0x10dfb2;
  x_00 = xvm_new(uVar15);
  if ((_Var8 & 1U) == 0 && !bVar16) {
    apvStack_b0[0] = (void *)0x10dfc7;
    local_50 = xvm_new(uVar15);
  }
  else {
    local_50 = (double *)0x0;
  }
  if (uVar15 != 0) {
    uVar13 = 0;
    do {
      if ((_Var8 & 1U) == 0 && !bVar16) {
        local_50[uVar13] = 0.0;
      }
      x_00[uVar13] = 0.0;
      x[uVar13] = 0.1;
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  pcVar3 = local_40->opt->rstate;
  nftr = uVar15;
  local_68 = pdVar10;
  if (pcVar3 != (char *)0x0) {
    apvStack_b0[0] = (void *)0x10e026;
    pFVar11 = fopen(pcVar3,"r");
    if (pFVar11 == (FILE *)0x0) {
      apvStack_b0[0] = (void *)0x10e03c;
      fatal("failed to open input state file");
    }
    apvStack_b0[0] = (void *)0x10e055;
    iVar9 = __isoc99_fscanf(pFVar11,"#state#%d#%lu\n",&local_60,&local_80);
    if (iVar9 != 2) {
      apvStack_b0[0] = (void *)0x10e068;
      fatal("invalid state file");
    }
    if (local_60 != 3) {
      apvStack_b0[0] = (void *)0x10e07c;
      fatal("state is not for rprop model");
    }
    if (local_80 != 0) {
      uVar14 = 0;
      do {
        apvStack_b0[0] = (void *)0x10e0b7;
        iVar9 = __isoc99_fscanf(pFVar11,"%lu %la %la %la\n",apvStack_b0 + 1,&f,&vxp,&vstp);
        if (iVar9 != 4) {
          apvStack_b0[0] = (void *)0x10e0ca;
          fatal("invalid state file");
        }
        if ((_Var8 & 1U) == 0 && !bVar16) {
          local_50[(long)apvStack_b0[1]] = (double)f;
        }
        x_00[(long)apvStack_b0[1]] = vstp;
        x[(long)apvStack_b0[1]] = vxp;
        uVar14 = uVar14 + 1;
      } while (uVar14 < local_80);
    }
    apvStack_b0[0] = (void *)0x10e118;
    fclose(pFVar11);
  }
  pdVar10 = local_68;
  apvStack_b0[0] = (void *)0x10e12a;
  local_31 = _Var8 | bVar16;
  puVar12 = (undefined8 *)xmalloc(0x28);
  *puVar12 = local_40;
  puVar12[1] = local_50;
  puVar12[2] = x;
  puVar12[3] = pdVar10;
  puVar12[4] = x_00;
  lVar4 = -((long)local_48 * 8 + 0xfU & 0xfffffffffffffff0);
  ud = (void **)((long)apvStack_b0 + lVar4 + 8U);
  if (local_48 != 0.0) {
    lVar1 = (long)local_48 - 1;
    auVar18._8_4_ = (int)lVar1;
    auVar18._0_8_ = lVar1;
    auVar18._12_4_ = (int)((ulong)lVar1 >> 0x20);
    lVar1 = (long)local_48 * 8;
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_001120c0;
    auVar19 = _DAT_001120b0;
    do {
      auVar21 = auVar19 ^ _DAT_001120c0;
      if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                  auVar18._4_4_ < auVar21._4_4_) & 1)) {
        *(undefined8 **)((long)ud + uVar14) = puVar12;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        *(undefined8 **)((long)&f + uVar14 + lVar4) = puVar12;
      }
      lVar20 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar20 + 2;
      uVar14 = uVar14 + 0x10;
    } while ((lVar1 + 8U & 0xfffffffffffffff0) != uVar14);
  }
  pmVar7 = local_40;
  vgp = (double)puVar12;
  *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e20f;
  local_70 = grd_new(pmVar7,pdVar10);
  it = 1;
  do {
    pgVar6 = local_70;
    if ((uit_stop != false) || (local_5c <= it - 1)) break;
    *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e238;
    dVar17 = grd_gradient(pgVar6);
    dVar5 = local_48;
    if (uit_stop != false) break;
    _type = dVar17;
    *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e25b;
    mth_spawn(trn_rpropsub,SUB84(dVar5,0),ud,0,0);
    pmVar7 = local_40;
    dVar5 = _type;
    *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e26c;
    _Var8 = uit_progress(pmVar7,it,dVar5);
    it = it + 1;
  } while (_Var8);
  pcVar3 = local_40->opt->sstate;
  if (pcVar3 != (char *)0x0) {
    *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e293;
    pFVar11 = fopen(pcVar3,"w");
    uVar15 = nftr;
    if (pFVar11 == (FILE *)0x0) {
      *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e2a9;
      fatal("failed to open output state file");
    }
    *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e2c1;
    fprintf(pFVar11,"#state#3#%lu\n",uVar15);
    if (uVar15 != 0) {
      uVar15 = 0;
      do {
        if (local_50 == (double *)0x0) {
          _type = 0.0;
        }
        else {
          _type = local_50[uVar15];
        }
        local_40 = (mdl_t *)x[uVar15];
        local_48 = x_00[uVar15];
        *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e314;
        fprintf(pFVar11,"%lu ",uVar15);
        pmVar7 = local_40;
        dVar17 = local_48;
        dVar5 = _type;
        *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e330;
        fprintf(pFVar11,"%la %la %la\n",dVar5,pmVar7,dVar17);
        uVar15 = uVar15 + 1;
      } while (nftr != uVar15);
    }
    *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e341;
    fclose(pFVar11);
  }
  pdVar10 = local_50;
  if ((local_31 & 1) == 0) {
    *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e350;
    xvm_free(pdVar10);
  }
  pdVar10 = local_68;
  *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e359;
  xvm_free(pdVar10);
  *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e361;
  xvm_free(x_00);
  *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e369;
  xvm_free(x);
  pgVar6 = local_70;
  *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e372;
  grd_free(pgVar6);
  dVar5 = vgp;
  *(undefined8 *)((long)apvStack_b0 + lVar4) = 0x10e37b;
  free((void *)dVar5);
  return;
}

Assistant:

void trn_rprop(mdl_t *mdl) {
	const uint64_t F   = mdl->nftr;
	const uint32_t K   = mdl->opt->maxiter;
	const uint32_t W   = mdl->opt->nthread;
	const bool     wbt = strcmp(mdl->opt->algo, "rprop-");
	const int      cut = mdl->opt->rprop.cutoff;
	// Allocate state memory and initialize it
	double *xp  = NULL,       *stp = xvm_new(F);
	double *g   = xvm_new(F), *gp  = xvm_new(F);
	if (wbt && !cut)
		xp = xvm_new(F);
	for (uint64_t f = 0; f < F; f++) {
		if (wbt && !cut)
			xp[f]  = 0.0;
		gp[f]  = 0.0;
		stp[f] = 0.1;
	}
	// Restore a saved state if given by the user
	if (mdl->opt->rstate != NULL) {
		const char *err = "invalid state file";
		FILE *file = fopen(mdl->opt->rstate, "r");
		if (file == NULL)
			fatal("failed to open input state file");
		int type;
		uint64_t nftr;
		if (fscanf(file, "#state#%d#%"SCNu64"\n", &type, &nftr) != 2)
			fatal(err);
		if (type != 3)
			fatal("state is not for rprop model");
		for (uint64_t i = 0; i < nftr; i++) {
			uint64_t f;
			double vxp, vstp, vgp;
			if (fscanf(file, "%"PRIu64" %la %la %la\n", &f, &vxp,
					&vstp, &vgp) != 4)
				fatal(err);
			if (wbt && !cut) xp[f] = vxp;
			gp[f] = vgp;
			stp[f] = vstp;
		}
		fclose(file);
	}
	// Prepare the rprop state used to send information to the rprop worker
	// about updating weight using the gradient.
	rprop_t *st = xmalloc(sizeof(rprop_t));
	st->mdl = mdl;
	st->xp  = xp;  st->stp = stp;
	st->g   = g;   st->gp  = gp;
	rprop_t *rprop[W];
	for (uint32_t w = 0; w < W; w++)
		rprop[w] = st;
	// Prepare the gradient state for the distributed gradient computation.
	grd_t *grd = grd_new(mdl, g);
	// And iterate the gradient computation / weight update process until
	// convergence or stop request
	for (uint32_t k = 0; !uit_stop && k < K; k++) {
		double fx = grd_gradient(grd);
		if (uit_stop)
			break;
		mth_spawn((func_t *)trn_rpropsub, W, (void **)rprop, 0, 0);
		if (uit_progress(mdl, k + 1, fx) == false)
			break;
	}
	// Save state if user requested it
	if (mdl->opt->sstate != NULL) {
		FILE *file = fopen(mdl->opt->sstate, "w");
		if (file == NULL)
			fatal("failed to open output state file");
		fprintf(file, "#state#3#%"PRIu64"\n", F);
		for (uint64_t f = 0; f < F; f++) {
			double vxp = xp != NULL ? xp[f] : 0.0;
			double vstp = stp[f], vgp = gp[f];
			fprintf(file, "%"PRIu64" ", f);
			fprintf(file, "%la %la %la\n", vxp, vstp, vgp);
		}
		fclose(file);
	}
	// Free all allocated memory
	if (wbt && !cut)
		xvm_free(xp);
	xvm_free(g);
	xvm_free(gp);
	xvm_free(stp);
	grd_free(grd);
	free(st);
}